

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Counter.cpp
# Opt level: O0

void __thiscall
Counter::Reset(Counter *this,shared_ptr<myvk::CommandPool> *command_pool,uint32_t value)

{
  initializer_list<VkBufferCopy> __l;
  element_type *__r;
  undefined4 in_EDX;
  uint64_t in_RDI;
  shared_ptr<myvk::CommandBuffer> command_buffer;
  shared_ptr<myvk::BufferBase> *in_stack_ffffffffffffff40;
  Fence *this_00;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffff54;
  VkDeviceSize in_stack_ffffffffffffff58;
  VkCommandBufferUsageFlags usage;
  vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *regions;
  CommandBuffer *in_stack_ffffffffffffff60;
  Ptr<BufferBase> *dst;
  uint *in_stack_ffffffffffffff68;
  allocator_type *__a;
  Buffer *in_stack_ffffffffffffff70;
  iterator pVVar2;
  size_type sVar3;
  VkCommandBufferLevel in_stack_ffffffffffffffc4;
  Ptr<CommandPool> *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  
  usage = (VkCommandBufferUsageFlags)(in_stack_ffffffffffffff58 >> 0x20);
  uVar1 = 0;
  myvk::CommandBuffer::Create(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  std::__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x154c04
            );
  myvk::Buffer::UpdateData<unsigned_int>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             (uint32_t)((ulong)in_stack_ffffffffffffff60 >> 0x20));
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x154c35);
  myvk::CommandBuffer::Begin(in_stack_ffffffffffffff60,usage);
  __r = std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x154c51);
  std::shared_ptr<myvk::BufferBase>::shared_ptr<myvk::Buffer,void>
            (in_stack_ffffffffffffff40,(shared_ptr<myvk::Buffer> *)__r);
  std::shared_ptr<myvk::BufferBase>::shared_ptr<myvk::Buffer,void>
            (in_stack_ffffffffffffff40,(shared_ptr<myvk::Buffer> *)__r);
  regions = (vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)0x0;
  dst = (Ptr<BufferBase> *)0x0;
  __a = (allocator_type *)0x4;
  pVVar2 = (iterator)&stack0xffffffffffffff58;
  sVar3 = 1;
  this_00 = (Fence *)&stack0xffffffffffffff57;
  std::allocator<VkBufferCopy>::allocator((allocator<VkBufferCopy> *)0x154cae);
  __l._M_len = sVar3;
  __l._M_array = pVVar2;
  std::vector<VkBufferCopy,_std::allocator<VkBufferCopy>_>::vector
            ((vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)in_stack_ffffffffffffff70,__l,
             __a);
  myvk::CommandBuffer::CmdCopy
            ((CommandBuffer *)in_stack_ffffffffffffff70,(Ptr<BufferBase> *)__a,dst,regions);
  std::vector<VkBufferCopy,_std::allocator<VkBufferCopy>_>::~vector
            ((vector<VkBufferCopy,_std::allocator<VkBufferCopy>_> *)
             CONCAT44(in_stack_ffffffffffffff54,uVar1));
  std::allocator<VkBufferCopy>::~allocator((allocator<VkBufferCopy> *)&stack0xffffffffffffff57);
  std::shared_ptr<myvk::BufferBase>::~shared_ptr((shared_ptr<myvk::BufferBase> *)0x154d01);
  std::shared_ptr<myvk::BufferBase>::~shared_ptr((shared_ptr<myvk::BufferBase> *)0x154d0b);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x154d18);
  myvk::CommandBuffer::End((CommandBuffer *)0x154d20);
  std::__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x154d2f);
  myvk::CommandBuffer::Submit
            ((CommandBuffer *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0),
             (Ptr<Fence> *)in_stack_ffffffffffffffc8);
  std::__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x154d50)
  ;
  myvk::Fence::Wait((Fence *)CONCAT44(in_stack_ffffffffffffff54,uVar1),in_RDI);
  std::__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<myvk::Fence,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x154d6f)
  ;
  myvk::Fence::Reset(this_00);
  std::shared_ptr<myvk::CommandBuffer>::~shared_ptr((shared_ptr<myvk::CommandBuffer> *)0x154d86);
  return;
}

Assistant:

void Counter::Reset(const std::shared_ptr<myvk::CommandPool> &command_pool, uint32_t value) {
	std::shared_ptr<myvk::CommandBuffer> command_buffer = myvk::CommandBuffer::Create(command_pool);
	m_staging_buffer->UpdateData((uint32_t)value, 0);
	command_buffer->Begin(VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT);
	command_buffer->CmdCopy(m_staging_buffer, m_buffer, {{0, 0, sizeof(uint32_t)}});
	command_buffer->End();
	command_buffer->Submit(m_fence);
	m_fence->Wait();
	m_fence->Reset();
}